

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O0

void __thiscall
ONX_ModelTest::Internal_ReadTest
          (ONX_ModelTest *this,ON_BinaryArchive *archive,Type test_type,bool bKeepModels,
          wchar_t *text_log_file_path,ON_TextLog *text_log)

{
  ON_SHA1_Hash *pOVar1;
  bool bVar2;
  archive_mode aVar3;
  uint uVar4;
  ON_wString *src;
  ONX_Model *pOVar5;
  char *pcVar6;
  size_t sz;
  char *sz_00;
  ON_Buffer *local_778;
  ON_Buffer *local_6b8;
  int local_644;
  uint compare_test_index;
  int buffer_index_2;
  bool bSkippedCompare;
  undefined4 uStack_635;
  undefined4 uStack_631;
  undefined4 local_62d;
  byte local_629;
  undefined1 local_628 [7];
  bool bRead1;
  ONX_ErrorCounter read1_error_counter;
  shared_ptr<ONX_Model> model1_sp;
  ONX_Model *model1;
  ON_String read1_description;
  ON_BinaryArchiveBuffer temporary_archive_1;
  int buffer_index_1;
  bool bWrite1;
  ONX_ErrorCounter write1_error_counter;
  ON_String write1_description;
  ON_BinaryArchiveBuffer temporary_archive;
  uint local_1b0;
  int buffer_index;
  uint temporary_buffer_3dm_version [2];
  undefined1 auStack_128 [8];
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 local_114;
  int local_110;
  byte local_109;
  undefined1 local_108 [7];
  bool bRead0;
  ONX_ErrorCounter read0_error_counter;
  ON_String read0_description;
  ON_String local_e0;
  ON_String text_log_3dm_archive_name;
  shared_ptr<ONX_Model> model0_sp;
  ONX_Model *model0;
  undefined1 local_b0 [8];
  ON_TextLogNull devnull;
  ON_TextLog *pOStack_30;
  uint current_3dm_file_version;
  ON_TextLog *text_log_local;
  wchar_t *text_log_file_path_local;
  bool bKeepModels_local;
  Type test_type_local;
  ON_BinaryArchive *archive_local;
  ONX_ModelTest *this_local;
  
  this->m_test_type = test_type;
  src = ON_BinaryArchive::ArchiveFullPath(archive);
  ON_wString::operator=(&this->m_source_3dm_file_path,src);
  ON_wString::operator=(&this->m_text_log_3dm_file_path,text_log_file_path);
  devnull.super_ON_TextLog._116_4_ = ON_BinaryArchive::CurrentArchiveVersion();
  ON_TextLogNull::ON_TextLogNull((ON_TextLogNull *)local_b0);
  pOStack_30 = text_log;
  if (text_log == (ON_TextLog *)0x0) {
    pOStack_30 = &ON_TextLog::Null;
  }
  sz = 1;
  Internal_BeginNextTest(this,Read);
  aVar3 = ON_BinaryArchive::Mode(archive);
  if (aVar3 == read3dm) {
    pOVar5 = (ONX_Model *)ONX_Model::operator_new((ONX_Model *)0xb88,sz);
    ONX_Model::ONX_Model(pOVar5);
    std::shared_ptr<ONX_Model>::shared_ptr<ONX_Model,void>
              ((shared_ptr<ONX_Model> *)&text_log_3dm_archive_name,pOVar5);
    if (bKeepModels) {
      std::shared_ptr<ONX_Model>::operator=
                (this->m_model,(shared_ptr<ONX_Model> *)&text_log_3dm_archive_name);
    }
    TextLogSource3dmFilePath((ONX_ModelTest *)&read0_description);
    ON_String::ON_String(&local_e0,(ON_wString *)&read0_description);
    ON_wString::~ON_wString((ON_wString *)&read0_description);
    bVar2 = ON_String::IsEmpty(&local_e0);
    if (bVar2) {
      ON_String::operator=(&local_e0,"archive");
    }
    pcVar6 = ON_String::operator_cast_to_char_(&local_e0);
    ON_String::FormatToString
              ((char *)&read0_error_counter.m_opennurbs_library_error_count,"ONX_Model.Read(%s,...)"
               ,pcVar6);
    pcVar6 = ON_String::operator_cast_to_char_
                       ((ON_String *)&read0_error_counter.m_opennurbs_library_error_count);
    ON_TextLog::Print(pOStack_30,"Calling %s ...\n",pcVar6);
    ON_TextLog::PushIndent(pOStack_30);
    ONX_ErrorCounter::ONX_ErrorCounter((ONX_ErrorCounter *)local_108);
    ONX_ErrorCounter::ClearLibraryErrorsAndWarnings((ONX_ErrorCounter *)local_108);
    local_109 = ONX_Model::Read(pOVar5,archive,pOStack_30);
    ONX_ErrorCounter::AddLibraryErrorsAndWarnings((ONX_ErrorCounter *)local_108);
    this->m_model_3dm_file_version[0] = pOVar5->m_3dm_file_version;
    ON_TextLog::PopIndent(pOStack_30);
    if ((local_109 & 1) == 0) {
      ONX_ErrorCounter::IncrementFailureCount(this->m_error_counts + this->m_current_test_index);
      pcVar6 = ON_String::operator_cast_to_char_
                         ((ON_String *)&read0_error_counter.m_opennurbs_library_error_count);
      ON_TextLog::Print(pOStack_30,"%s failed.\n",pcVar6);
      local_110 = 2;
    }
    else {
      pcVar6 = ON_String::operator_cast_to_char_
                         ((ON_String *)&read0_error_counter.m_opennurbs_library_error_count);
      ON_TextLog::Print(pOStack_30,"... %s ",pcVar6);
      uVar4 = ONX_ErrorCounter::TotalCount((ONX_ErrorCounter *)local_108);
      if (uVar4 == 0) {
        ON_TextLog::Print(pOStack_30,"succeeded.");
      }
      else {
        ON_TextLog::Print(pOStack_30,"finished. ");
        ONX_ErrorCounter::Dump((ONX_ErrorCounter *)local_108,pOStack_30);
      }
      ON_TextLog::PrintNewLine(pOStack_30);
      ON_TextLog::PushIndent(pOStack_30);
      ON_TextLog::Print(pOStack_30,"Source model 3dm file version: %d",
                        (ulong)(uint)pOVar5->m_3dm_file_version);
      ON_TextLog::PrintNewLine(pOStack_30);
      ONX_Model::ContentHash((ON_SHA1_Hash *)(auStack_128 + 4),pOVar5);
      *(undefined4 *)(this->m_model_hash[0].m_digest + 0x10) = local_114;
      *(undefined4 *)this->m_model_hash[0].m_digest = auStack_128._4_4_;
      *(undefined4 *)(this->m_model_hash[0].m_digest + 4) = uStack_120;
      *(undefined4 *)(this->m_model_hash[0].m_digest + 8) = uStack_11c;
      *(undefined4 *)(this->m_model_hash[0].m_digest + 0xc) = uStack_118;
      ON_TextLog::Print(pOStack_30,"Source model hash: ");
      ON_SHA1_Hash::Dump(this->m_model_hash,pOStack_30);
      ON_TextLog::PrintNewLine(pOStack_30);
      ON_TextLog::PopIndent(pOStack_30);
      if (test_type == Read) {
        local_110 = 2;
      }
      else {
        Internal_EndCurrentTest(this);
        Internal_BeginNextTest(this,ReadWrite);
        local_6b8 = (ON_Buffer *)temporary_buffer_3dm_version;
        do {
          ON_Buffer::ON_Buffer(local_6b8);
          local_6b8 = local_6b8 + 1;
        } while (local_6b8 != (ON_Buffer *)auStack_128);
        local_1b0 = devnull.super_ON_TextLog._116_4_ - 10;
        buffer_index._0_1_ = devnull.super_ON_TextLog.m_bNullTextLog;
        buffer_index._1_1_ = devnull.super_ON_TextLog.m_level_of_detail;
        buffer_index._2_1_ = devnull.super_ON_TextLog.m_color_format;
        buffer_index._3_1_ = devnull.super_ON_TextLog.m_reserved1;
        for (temporary_archive.m_buffer._4_4_ = 0; temporary_archive.m_buffer._4_4_ < 2;
            temporary_archive.m_buffer._4_4_ = temporary_archive.m_buffer._4_4_ + 1) {
          ON_BinaryArchiveBuffer::ON_BinaryArchiveBuffer
                    ((ON_BinaryArchiveBuffer *)&write1_description,write3dm,
                     (ON_Buffer *)
                     (temporary_buffer_3dm_version + (long)temporary_archive.m_buffer._4_4_ * 0x10))
          ;
          ON_String::FormatToString
                    ((char *)&write1_error_counter.m_opennurbs_library_error_count,
                     "ONX_Model.Write( temporary_archive version %d, ...)",
                     (ulong)(&local_1b0)[temporary_archive.m_buffer._4_4_]);
          pcVar6 = ON_String::operator_cast_to_char_
                             ((ON_String *)&write1_error_counter.m_opennurbs_library_error_count);
          ON_TextLog::Print(pOStack_30,"Calling %s ...\n",pcVar6);
          ON_TextLog::PushIndent(pOStack_30);
          ONX_ErrorCounter::ONX_ErrorCounter((ONX_ErrorCounter *)&buffer_index_1);
          ONX_ErrorCounter::ClearLibraryErrorsAndWarnings((ONX_ErrorCounter *)&buffer_index_1);
          bVar2 = ONX_Model::Write(pOVar5,(ON_BinaryArchive *)&write1_description,
                                   (&local_1b0)[temporary_archive.m_buffer._4_4_],pOStack_30);
          ONX_ErrorCounter::AddLibraryErrorsAndWarnings((ONX_ErrorCounter *)&buffer_index_1);
          ON_TextLog::PopIndent(pOStack_30);
          if (bVar2) {
            pcVar6 = ON_String::operator_cast_to_char_
                               ((ON_String *)&write1_error_counter.m_opennurbs_library_error_count);
            ON_TextLog::Print(pOStack_30,"... %s ",pcVar6);
            uVar4 = ONX_ErrorCounter::TotalCount((ONX_ErrorCounter *)&buffer_index_1);
            if (uVar4 == 0) {
              ON_TextLog::Print(pOStack_30,"succeeded.");
            }
            else {
              ON_TextLog::Print(pOStack_30,"finished. ");
              ONX_ErrorCounter::Dump((ONX_ErrorCounter *)&buffer_index_1,pOStack_30);
            }
            ON_TextLog::PrintNewLine(pOStack_30);
            local_110 = 0;
          }
          else {
            ONX_ErrorCounter::IncrementFailureCount
                      (this->m_error_counts + this->m_current_test_index);
            pcVar6 = ON_String::operator_cast_to_char_
                               ((ON_String *)&write1_error_counter.m_opennurbs_library_error_count);
            ON_TextLog::Print(pOStack_30,"%s failed.\n",pcVar6);
            local_110 = 4;
          }
          ON_String::~ON_String((ON_String *)&write1_error_counter.m_opennurbs_library_error_count);
          ON_BinaryArchiveBuffer::~ON_BinaryArchiveBuffer
                    ((ON_BinaryArchiveBuffer *)&write1_description);
          if (local_110 != 0) break;
        }
        if (test_type != ReadWrite) {
          Internal_EndCurrentTest(this);
          Internal_BeginNextTest(this,ReadWriteRead);
          for (temporary_archive_1.m_buffer._0_4_ = 0; (int)temporary_archive_1.m_buffer < 2;
              temporary_archive_1.m_buffer._0_4_ = (int)temporary_archive_1.m_buffer + 1) {
            ON_BinaryArchiveBuffer::ON_BinaryArchiveBuffer
                      ((ON_BinaryArchiveBuffer *)&read1_description,read3dm,
                       (ON_Buffer *)
                       (temporary_buffer_3dm_version +
                       (long)(int)temporary_archive_1.m_buffer * 0x10));
            ON_String::FormatToString
                      ((char *)&model1,"ONX_Model.Read( temporary_archive version %d, ...)",
                       (ulong)(&local_1b0)[(int)temporary_archive_1.m_buffer]);
            pcVar6 = ON_String::operator_cast_to_char_((ON_String *)&model1);
            sz_00 = "Calling %s ...\n";
            ON_TextLog::Print(pOStack_30,"Calling %s ...\n",pcVar6);
            ON_TextLog::PushIndent(pOStack_30);
            pOVar5 = (ONX_Model *)ONX_Model::operator_new((ONX_Model *)0xb88,(size_t)sz_00);
            ONX_Model::ONX_Model(pOVar5);
            std::shared_ptr<ONX_Model>::shared_ptr<ONX_Model,void>
                      ((shared_ptr<ONX_Model> *)&read1_error_counter.m_opennurbs_library_error_count
                       ,pOVar5);
            if (bKeepModels) {
              std::shared_ptr<ONX_Model>::operator=
                        (this->m_model + ((int)temporary_archive_1.m_buffer + 1),
                         (shared_ptr<ONX_Model> *)
                         &read1_error_counter.m_opennurbs_library_error_count);
            }
            ONX_ErrorCounter::ONX_ErrorCounter((ONX_ErrorCounter *)local_628);
            ONX_ErrorCounter::ClearLibraryErrorsAndWarnings((ONX_ErrorCounter *)local_628);
            local_629 = ONX_Model::Read(pOVar5,(ON_BinaryArchive *)&read1_description,pOStack_30);
            ONX_ErrorCounter::AddLibraryErrorsAndWarnings((ONX_ErrorCounter *)local_628);
            this->m_model_3dm_file_version[(long)(int)temporary_archive_1.m_buffer + 1] =
                 pOVar5->m_3dm_file_version;
            ON_TextLog::PopIndent(pOStack_30);
            if ((local_629 & 1) == 0) {
              ONX_ErrorCounter::IncrementFailureCount
                        (this->m_error_counts + this->m_current_test_index);
              pcVar6 = ON_String::operator_cast_to_char_((ON_String *)&model1);
              ON_TextLog::Print(pOStack_30,"%s failed.\n",pcVar6);
              local_110 = 7;
            }
            else {
              pcVar6 = ON_String::operator_cast_to_char_((ON_String *)&model1);
              ON_TextLog::Print(pOStack_30,"... %s ",pcVar6);
              uVar4 = ONX_ErrorCounter::TotalCount((ONX_ErrorCounter *)local_628);
              if (uVar4 == 0) {
                ON_TextLog::Print(pOStack_30,"succeeded.");
              }
              else {
                ON_TextLog::Print(pOStack_30,"finished. ");
                ONX_ErrorCounter::Dump((ONX_ErrorCounter *)local_628,pOStack_30);
              }
              ON_TextLog::PrintNewLine(pOStack_30);
              ON_TextLog::PushIndent(pOStack_30);
              ON_TextLog::Print(pOStack_30,"Temporary model %d 3dm file version: %d",
                                (ulong)((int)temporary_archive_1.m_buffer + 1),
                                (ulong)(uint)pOVar5->m_3dm_file_version);
              ON_TextLog::PrintNewLine(pOStack_30);
              ONX_Model::ContentHash((ON_SHA1_Hash *)((long)&compare_test_index + 3),pOVar5);
              *(undefined4 *)
               (this->m_model_hash[(int)temporary_archive_1.m_buffer + 1].m_digest + 0x10) =
                   local_62d;
              pOVar1 = this->m_model_hash + ((int)temporary_archive_1.m_buffer + 1);
              *(undefined4 *)pOVar1->m_digest = stack0xfffffffffffff9c3;
              *(undefined4 *)(pOVar1->m_digest + 4) = stack0xfffffffffffff9c7;
              *(undefined4 *)(pOVar1->m_digest + 8) = uStack_635;
              *(undefined4 *)(pOVar1->m_digest + 0xc) = uStack_631;
              ON_TextLog::Print(pOStack_30,"Temporary model %d hash: ",
                                (ulong)((int)temporary_archive_1.m_buffer + 1));
              ON_SHA1_Hash::Dump(this->m_model_hash + ((int)temporary_archive_1.m_buffer + 1),
                                 pOStack_30);
              ON_TextLog::PrintNewLine(pOStack_30);
              ON_TextLog::PopIndent(pOStack_30);
              local_110 = 0;
            }
            std::shared_ptr<ONX_Model>::~shared_ptr
                      ((shared_ptr<ONX_Model> *)&read1_error_counter.m_opennurbs_library_error_count
                      );
            ON_String::~ON_String((ON_String *)&model1);
            ON_BinaryArchiveBuffer::~ON_BinaryArchiveBuffer
                      ((ON_BinaryArchiveBuffer *)&read1_description);
            if (local_110 != 0) break;
          }
          if (test_type != ReadWrite) {
            Internal_EndCurrentTest(this);
            Internal_BeginNextTest(this,ReadWriteReadCompare);
            compare_test_index._2_1_ = 1;
            for (local_644 = 0; local_644 < 2; local_644 = local_644 + 1) {
              if ((this->m_model_3dm_file_version[0] ==
                   this->m_model_3dm_file_version[local_644 + 1]) &&
                 (this->m_model_3dm_file_version[0] == (&local_1b0)[local_644])) {
                compare_test_index._2_1_ = 0;
                bVar2 = ::operator!=(this->m_model_hash,this->m_model_hash + (local_644 + 1));
                if (bVar2) {
                  ONX_ErrorCounter::IncrementFailureCount
                            (this->m_error_counts + this->m_current_test_index);
                  ON_TextLog::Print(pOStack_30,
                                    "The source model and temporary model %d are different.\n",
                                    (ulong)(local_644 + 1));
                  break;
                }
                ON_TextLog::Print(pOStack_30,
                                  "The source model and temporary model %d are identical.\n",
                                  (ulong)(local_644 + 1));
              }
            }
            if ((compare_test_index._2_1_ & 1) != 0) {
              this->m_test_results[this->m_current_test_index] = Skip;
            }
          }
        }
        local_110 = 2;
        local_778 = (ON_Buffer *)auStack_128;
        do {
          local_778 = local_778 + -1;
          ON_Buffer::~ON_Buffer(local_778);
        } while (local_778 != (ON_Buffer *)temporary_buffer_3dm_version);
      }
    }
    ON_String::~ON_String((ON_String *)&read0_error_counter.m_opennurbs_library_error_count);
    ON_String::~ON_String(&local_e0);
    std::shared_ptr<ONX_Model>::~shared_ptr((shared_ptr<ONX_Model> *)&text_log_3dm_archive_name);
  }
  else {
    ONX_ErrorCounter::IncrementFailureCount(this->m_error_counts);
    ON_TextLog::Print(pOStack_30,"archive.Mode() must be ON::archive_mode::read3dm.");
  }
  Internal_EndCurrentTest(this);
  ON_TextLogNull::~ON_TextLogNull((ON_TextLogNull *)local_b0);
  return;
}

Assistant:

void ONX_ModelTest::Internal_ReadTest(
  ON_BinaryArchive& archive,
  ONX_ModelTest::Type test_type,
  bool bKeepModels,
  const wchar_t* text_log_file_path,
  ON_TextLog* text_log
)
{
  m_test_type = test_type;
  m_source_3dm_file_path = archive.ArchiveFullPath();
  m_text_log_3dm_file_path = text_log_file_path;

  const unsigned int current_3dm_file_version = (unsigned int)ON_BinaryArchive::CurrentArchiveVersion();

  ON_TextLogNull devnull;
  if (nullptr == text_log)
    text_log = &ON_TextLog::Null;

  for (;;)
  {
    Internal_BeginNextTest(ONX_ModelTest::Type::Read);

    if ( ON::archive_mode::read3dm != archive.Mode() )
    {
      m_error_counts[0].IncrementFailureCount();
      text_log->Print("archive.Mode() must be ON::archive_mode::read3dm.");
      break;
    }

    ONX_Model* model0 = new ONX_Model();
    std::shared_ptr<ONX_Model> model0_sp = std::shared_ptr<ONX_Model>(model0);
    if (bKeepModels)
      this->m_model[0] = model0_sp;

    ON_String text_log_3dm_archive_name = TextLogSource3dmFilePath();
    if (text_log_3dm_archive_name.IsEmpty())
    {
      text_log_3dm_archive_name = "archive";
    }

    const ON_String read0_description
      = ON_String::FormatToString("ONX_Model.Read(%s,...)", static_cast<const char*>(text_log_3dm_archive_name));

    // read the original file
    text_log->Print("Calling %s ...\n", static_cast<const char*>(read0_description));
    text_log->PushIndent();
    ONX_ErrorCounter read0_error_counter;
    read0_error_counter.ClearLibraryErrorsAndWarnings();
    const bool bRead0 = model0->Read(archive, text_log);
    read0_error_counter.AddLibraryErrorsAndWarnings();
    m_model_3dm_file_version[0] = model0->m_3dm_file_version;

    text_log->PopIndent();

    if (false == bRead0)
    {
      m_error_counts[m_current_test_index].IncrementFailureCount();
      text_log->Print("%s failed.\n", static_cast<const char*>(read0_description));
      break;
    }
    else
    {
      text_log->Print("... %s ", static_cast<const char*>(read0_description));
      if ( 0 == read0_error_counter.TotalCount() )
        text_log->Print("succeeded.");
      else
      {
        text_log->Print("finished. ");
        read0_error_counter.Dump(*text_log);
      }
      text_log->PrintNewLine();

    }
    text_log->PushIndent();
    text_log->Print("Source model 3dm file version: %d", model0->m_3dm_file_version);
    text_log->PrintNewLine();
    m_model_hash[0] = model0->ContentHash();
    text_log->Print("Source model hash: ");
    m_model_hash[0].Dump(*text_log);
    text_log->PrintNewLine();
    text_log->PopIndent();

    if ( ONX_ModelTest::Type::Read == test_type)
      break;
    Internal_EndCurrentTest();
    Internal_BeginNextTest(ONX_ModelTest::Type::ReadWrite);

    //const unsigned int original_model_3dm_file_version = (unsigned int)(model0->m_3dm_file_version);

    // Write original_model to a termporary archive using "buffer" for storage. 
    ON_Buffer temporary_buffer[2];
    const unsigned int temporary_buffer_3dm_version[2] = { current_3dm_file_version - 10, current_3dm_file_version };

    for (int buffer_index = 0; buffer_index < 2; buffer_index++)
    {
      ON_BinaryArchiveBuffer temporary_archive(ON::archive_mode::write3dm, &temporary_buffer[buffer_index]);

      const ON_String write1_description
        = ON_String::FormatToString(
          "ONX_Model.Write( temporary_archive version %d, ...)",
          temporary_buffer_3dm_version[buffer_index]);

      text_log->Print("Calling %s ...\n", static_cast<const char*>(write1_description));
      text_log->PushIndent();
      ONX_ErrorCounter write1_error_counter;
      write1_error_counter.ClearLibraryErrorsAndWarnings();
      bool bWrite1 = model0->Write(temporary_archive, temporary_buffer_3dm_version[buffer_index], text_log);
      write1_error_counter.AddLibraryErrorsAndWarnings();
      text_log->PopIndent();

      if (false == bWrite1)
      {
        m_error_counts[m_current_test_index].IncrementFailureCount();
        text_log->Print("%s failed.\n", static_cast<const char*>(write1_description));
        break;
      }
      else
      {
        text_log->Print("... %s ", static_cast<const char*>(write1_description));
        if ( 0 == write1_error_counter.TotalCount() )
          text_log->Print("succeeded.");
        else
        {
          text_log->Print("finished. ");
          write1_error_counter.Dump(*text_log);
        }
        text_log->PrintNewLine();
      }
    }

    // no longer need model0
    model0 = nullptr;

    if ( ONX_ModelTest::Type::ReadWrite == test_type)
      break;
    Internal_EndCurrentTest();
    Internal_BeginNextTest(ONX_ModelTest::Type::ReadWriteRead);

    // read models from the temporary archives
    for (int buffer_index = 0; buffer_index < 2; buffer_index++)
    {
      ON_BinaryArchiveBuffer temporary_archive(ON::archive_mode::read3dm, &temporary_buffer[buffer_index]);
      const ON_String read1_description
        = ON_String::FormatToString(
          "ONX_Model.Read( temporary_archive version %d, ...)",
          temporary_buffer_3dm_version[buffer_index]);

      text_log->Print("Calling %s ...\n", static_cast<const char*>(read1_description));
      text_log->PushIndent();

      ONX_Model* model1 = new ONX_Model();
      std::shared_ptr<ONX_Model> model1_sp = std::shared_ptr<ONX_Model>(model1);
      if (bKeepModels)
        this->m_model[buffer_index+1] = model1_sp;

      ONX_ErrorCounter read1_error_counter;
      read1_error_counter.ClearLibraryErrorsAndWarnings();
      const bool bRead1 = model1->Read(temporary_archive, text_log);
      read1_error_counter.AddLibraryErrorsAndWarnings();      
      m_model_3dm_file_version[buffer_index + 1] = model1->m_3dm_file_version;

      text_log->PopIndent();

      if (false == bRead1)
      {
        m_error_counts[m_current_test_index].IncrementFailureCount();
        text_log->Print("%s failed.\n", static_cast<const char*>(read1_description));
        break;
      }
      else
      {
        text_log->Print("... %s ", static_cast<const char*>(read1_description));
        if ( 0 == read1_error_counter.TotalCount())
          text_log->Print("succeeded.");
        else
        {
          text_log->Print("finished. ");
          read1_error_counter.Dump(*text_log);
        }
        text_log->PrintNewLine();
      }
      text_log->PushIndent();
      text_log->Print("Temporary model %d 3dm file version: %d",buffer_index+1,model1->m_3dm_file_version);
      text_log->PrintNewLine();
      m_model_hash[buffer_index+1] = model1->ContentHash();
      text_log->Print("Temporary model %d hash: ",buffer_index+1);
      m_model_hash[buffer_index+1].Dump(*text_log);
      text_log->PrintNewLine();
      text_log->PopIndent();
    }

    if ( ONX_ModelTest::Type::ReadWrite == test_type)
      break;
    Internal_EndCurrentTest();
    Internal_BeginNextTest(ONX_ModelTest::Type::ReadWriteReadCompare);

    bool bSkippedCompare = true;
    for (int buffer_index = 0; buffer_index < 2; buffer_index++)
    {
      if (m_model_3dm_file_version[0] != m_model_3dm_file_version[buffer_index+1])
        continue;
      if (m_model_3dm_file_version[0] != temporary_buffer_3dm_version[buffer_index])
        continue;

      bSkippedCompare = false;
      if (m_model_hash[0] != m_model_hash[buffer_index+1])
      {
        m_error_counts[m_current_test_index].IncrementFailureCount();
        text_log->Print("The source model and temporary model %d are different.\n",buffer_index+1);
        break;
      }
      else
      {
        text_log->Print("The source model and temporary model %d are identical.\n",buffer_index+1);
      }
    }

    unsigned int compare_test_index = m_current_test_index;
    if (bSkippedCompare)
      this->m_test_results[compare_test_index] = ONX_ModelTest::Result::Skip;
            
    break;
  }

  Internal_EndCurrentTest();
}